

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::Dropout::forward_impl
          (Dropout *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  Tensor *pTVar1;
  float *pfVar2;
  float *pfVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float p;
  undefined8 uVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  Index index_1;
  ulong uVar14;
  ulong uVar15;
  ushort uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  int iVar26;
  int iVar27;
  Tensor m;
  undefined1 local_68 [48];
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> vStack_38;
  
  local_68._32_4_ = (this->super_Node).dim.bd;
  local_68._40_8_ = (this->super_Node).aux_mem;
  local_68._0_8_ = *(undefined8 *)(this->super_Node).dim.d;
  local_68._8_8_ = *(undefined8 *)((this->super_Node).dim.d + 2);
  local_68._16_8_ = *(undefined8 *)((this->super_Node).dim.d + 4);
  local_68._24_8_ = *(undefined8 *)((this->super_Node).dim.d + 6);
  vStack_38.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  vStack_38.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p = 1.0 - this->p;
  TensorTools::RandomBernoulli((Tensor *)local_68,p,1.0 / p);
  iVar26 = 1;
  pTVar1 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  iVar27 = 1;
  uVar13 = (ulong)(pTVar1->d).nd;
  if (uVar13 != 0) {
    auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar21 = vpbroadcastq_avx512f();
    uVar12 = 0;
    do {
      auVar22 = vpbroadcastq_avx512f();
      auVar23 = vmovdqa64_avx512f(auVar18);
      auVar18 = vporq_avx512f(auVar22,auVar19);
      auVar22 = vporq_avx512f(auVar22,auVar20);
      uVar7 = vpcmpuq_avx512f(auVar22,auVar21,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar18,auVar21,2);
      bVar9 = (byte)uVar7;
      uVar16 = CONCAT11(bVar9,bVar8);
      auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar1->d).d + uVar12));
      auVar22._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar18._4_4_;
      auVar22._0_4_ = (uint)(bVar8 & 1) * auVar18._0_4_;
      auVar22._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar18._8_4_;
      auVar22._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar18._12_4_;
      auVar22._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar18._16_4_;
      auVar22._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar18._20_4_;
      auVar22._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar18._24_4_;
      auVar22._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar18._28_4_;
      auVar22._32_4_ = (uint)(bVar9 & 1) * auVar18._32_4_;
      auVar22._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar18._36_4_;
      auVar22._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar18._40_4_;
      auVar22._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar18._44_4_;
      auVar22._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar18._48_4_;
      auVar22._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar18._52_4_;
      auVar22._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar18._56_4_;
      auVar22._60_4_ = (uint)(bVar9 >> 7) * auVar18._60_4_;
      uVar12 = uVar12 + 0x10;
      auVar18 = vpmulld_avx512f(auVar22,auVar23);
    } while ((uVar13 + 0xf & 0x1fffffff0) != uVar12);
    auVar19 = vmovdqa32_avx512f(auVar18);
    auVar18._0_4_ = (uint)(bVar8 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar23._0_4_;
    bVar4 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar18._4_4_ = (uint)bVar4 * auVar19._4_4_ | (uint)!bVar4 * auVar23._4_4_;
    bVar4 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar18._8_4_ = (uint)bVar4 * auVar19._8_4_ | (uint)!bVar4 * auVar23._8_4_;
    bVar4 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar18._12_4_ = (uint)bVar4 * auVar19._12_4_ | (uint)!bVar4 * auVar23._12_4_;
    bVar4 = (bool)((byte)(uVar16 >> 4) & 1);
    auVar18._16_4_ = (uint)bVar4 * auVar19._16_4_ | (uint)!bVar4 * auVar23._16_4_;
    bVar4 = (bool)((byte)(uVar16 >> 5) & 1);
    auVar18._20_4_ = (uint)bVar4 * auVar19._20_4_ | (uint)!bVar4 * auVar23._20_4_;
    bVar4 = (bool)((byte)(uVar16 >> 6) & 1);
    auVar18._24_4_ = (uint)bVar4 * auVar19._24_4_ | (uint)!bVar4 * auVar23._24_4_;
    bVar4 = (bool)((byte)(uVar16 >> 7) & 1);
    auVar18._28_4_ = (uint)bVar4 * auVar19._28_4_ | (uint)!bVar4 * auVar23._28_4_;
    auVar18._32_4_ = (uint)(bVar9 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar23._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar18._36_4_ = (uint)bVar4 * auVar19._36_4_ | (uint)!bVar4 * auVar23._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar18._40_4_ = (uint)bVar4 * auVar19._40_4_ | (uint)!bVar4 * auVar23._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar18._44_4_ = (uint)bVar4 * auVar19._44_4_ | (uint)!bVar4 * auVar23._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar18._48_4_ = (uint)bVar4 * auVar19._48_4_ | (uint)!bVar4 * auVar23._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar18._52_4_ = (uint)bVar4 * auVar19._52_4_ | (uint)!bVar4 * auVar23._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar18._56_4_ = (uint)bVar4 * auVar19._56_4_ | (uint)!bVar4 * auVar23._56_4_;
    auVar18._60_4_ =
         (uint)(bVar9 >> 7) * auVar19._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar23._60_4_;
    auVar17 = vextracti64x4_avx512f(auVar18,1);
    auVar18 = vpmulld_avx512f(auVar18,ZEXT3264(auVar17));
    auVar5 = vpmulld_avx(auVar18._0_16_,auVar18._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    iVar26 = auVar5._0_4_;
  }
  uVar11 = iVar26 * (pTVar1->d).bd;
  if ((ulong)local_68._24_8_ >> 0x20 != 0) {
    auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar21 = vpbroadcastq_avx512f();
    uVar13 = 0;
    do {
      auVar22 = vpbroadcastq_avx512f();
      auVar23 = vmovdqa64_avx512f(auVar18);
      auVar18 = vporq_avx512f(auVar22,auVar19);
      auVar22 = vporq_avx512f(auVar22,auVar20);
      uVar7 = vpcmpuq_avx512f(auVar22,auVar21,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar18,auVar21,2);
      bVar9 = (byte)uVar7;
      uVar16 = CONCAT11(bVar9,bVar8);
      auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])(local_68 + uVar13 * 4));
      auVar24._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar18._4_4_;
      auVar24._0_4_ = (uint)(bVar8 & 1) * auVar18._0_4_;
      auVar24._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar18._8_4_;
      auVar24._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar18._12_4_;
      auVar24._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar18._16_4_;
      auVar24._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar18._20_4_;
      auVar24._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar18._24_4_;
      auVar24._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar18._28_4_;
      auVar24._32_4_ = (uint)(bVar9 & 1) * auVar18._32_4_;
      auVar24._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar18._36_4_;
      auVar24._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar18._40_4_;
      auVar24._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar18._44_4_;
      auVar24._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar18._48_4_;
      auVar24._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar18._52_4_;
      auVar24._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar18._56_4_;
      auVar24._60_4_ = (uint)(bVar9 >> 7) * auVar18._60_4_;
      uVar13 = uVar13 + 0x10;
      auVar18 = vpmulld_avx512f(auVar24,auVar23);
    } while ((((ulong)local_68._24_8_ >> 0x20) + 0xf & 0x1fffffff0) != uVar13);
    auVar18 = vmovdqa32_avx512f(auVar18);
    auVar19._0_4_ = (uint)(bVar8 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar23._0_4_;
    bVar4 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar19._4_4_ = (uint)bVar4 * auVar18._4_4_ | (uint)!bVar4 * auVar23._4_4_;
    bVar4 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar19._8_4_ = (uint)bVar4 * auVar18._8_4_ | (uint)!bVar4 * auVar23._8_4_;
    bVar4 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar19._12_4_ = (uint)bVar4 * auVar18._12_4_ | (uint)!bVar4 * auVar23._12_4_;
    bVar4 = (bool)((byte)(uVar16 >> 4) & 1);
    auVar19._16_4_ = (uint)bVar4 * auVar18._16_4_ | (uint)!bVar4 * auVar23._16_4_;
    bVar4 = (bool)((byte)(uVar16 >> 5) & 1);
    auVar19._20_4_ = (uint)bVar4 * auVar18._20_4_ | (uint)!bVar4 * auVar23._20_4_;
    bVar4 = (bool)((byte)(uVar16 >> 6) & 1);
    auVar19._24_4_ = (uint)bVar4 * auVar18._24_4_ | (uint)!bVar4 * auVar23._24_4_;
    bVar4 = (bool)((byte)(uVar16 >> 7) & 1);
    auVar19._28_4_ = (uint)bVar4 * auVar18._28_4_ | (uint)!bVar4 * auVar23._28_4_;
    auVar19._32_4_ = (uint)(bVar9 & 1) * auVar18._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar23._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar19._36_4_ = (uint)bVar4 * auVar18._36_4_ | (uint)!bVar4 * auVar23._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar19._40_4_ = (uint)bVar4 * auVar18._40_4_ | (uint)!bVar4 * auVar23._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar19._44_4_ = (uint)bVar4 * auVar18._44_4_ | (uint)!bVar4 * auVar23._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar19._48_4_ = (uint)bVar4 * auVar18._48_4_ | (uint)!bVar4 * auVar23._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar19._52_4_ = (uint)bVar4 * auVar18._52_4_ | (uint)!bVar4 * auVar23._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar19._56_4_ = (uint)bVar4 * auVar18._56_4_ | (uint)!bVar4 * auVar23._56_4_;
    auVar19._60_4_ =
         (uint)(bVar9 >> 7) * auVar18._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar23._60_4_;
    auVar17 = vextracti64x4_avx512f(auVar19,1);
    auVar18 = vpmulld_avx512f(auVar19,ZEXT3264(auVar17));
    auVar5 = vpmulld_avx(auVar18._0_16_,auVar18._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    iVar27 = auVar5._0_4_;
  }
  uVar13 = (ulong)(uint)(iVar27 * local_68._32_4_);
  if (uVar11 != iVar27 * local_68._32_4_) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                 );
  }
  uVar12 = (ulong)(fx->d).nd;
  if (uVar12 == 0) {
    iVar27 = 1;
  }
  else {
    auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar21 = vpbroadcastq_avx512f();
    uVar10 = 0;
    do {
      auVar22 = vpbroadcastq_avx512f();
      auVar23 = vmovdqa64_avx512f(auVar18);
      auVar18 = vporq_avx512f(auVar22,auVar19);
      auVar22 = vporq_avx512f(auVar22,auVar20);
      uVar7 = vpcmpuq_avx512f(auVar22,auVar21,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar18,auVar21,2);
      bVar9 = (byte)uVar7;
      uVar16 = CONCAT11(bVar9,bVar8);
      auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar10));
      auVar25._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar18._4_4_;
      auVar25._0_4_ = (uint)(bVar8 & 1) * auVar18._0_4_;
      auVar25._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar18._8_4_;
      auVar25._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar18._12_4_;
      auVar25._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar18._16_4_;
      auVar25._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar18._20_4_;
      auVar25._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar18._24_4_;
      auVar25._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar18._28_4_;
      auVar25._32_4_ = (uint)(bVar9 & 1) * auVar18._32_4_;
      auVar25._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar18._36_4_;
      auVar25._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar18._40_4_;
      auVar25._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar18._44_4_;
      auVar25._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar18._48_4_;
      auVar25._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar18._52_4_;
      auVar25._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar18._56_4_;
      auVar25._60_4_ = (uint)(bVar9 >> 7) * auVar18._60_4_;
      uVar10 = uVar10 + 0x10;
      auVar18 = vpmulld_avx512f(auVar25,auVar23);
    } while ((uVar12 + 0xf & 0x1fffffff0) != uVar10);
    auVar18 = vmovdqa32_avx512f(auVar18);
    auVar20._0_4_ = (uint)(bVar8 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar23._0_4_;
    bVar4 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar20._4_4_ = (uint)bVar4 * auVar18._4_4_ | (uint)!bVar4 * auVar23._4_4_;
    bVar4 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar20._8_4_ = (uint)bVar4 * auVar18._8_4_ | (uint)!bVar4 * auVar23._8_4_;
    bVar4 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar20._12_4_ = (uint)bVar4 * auVar18._12_4_ | (uint)!bVar4 * auVar23._12_4_;
    bVar4 = (bool)((byte)(uVar16 >> 4) & 1);
    auVar20._16_4_ = (uint)bVar4 * auVar18._16_4_ | (uint)!bVar4 * auVar23._16_4_;
    bVar4 = (bool)((byte)(uVar16 >> 5) & 1);
    auVar20._20_4_ = (uint)bVar4 * auVar18._20_4_ | (uint)!bVar4 * auVar23._20_4_;
    bVar4 = (bool)((byte)(uVar16 >> 6) & 1);
    auVar20._24_4_ = (uint)bVar4 * auVar18._24_4_ | (uint)!bVar4 * auVar23._24_4_;
    bVar4 = (bool)((byte)(uVar16 >> 7) & 1);
    auVar20._28_4_ = (uint)bVar4 * auVar18._28_4_ | (uint)!bVar4 * auVar23._28_4_;
    auVar20._32_4_ = (uint)(bVar9 & 1) * auVar18._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar23._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar20._36_4_ = (uint)bVar4 * auVar18._36_4_ | (uint)!bVar4 * auVar23._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar20._40_4_ = (uint)bVar4 * auVar18._40_4_ | (uint)!bVar4 * auVar23._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar20._44_4_ = (uint)bVar4 * auVar18._44_4_ | (uint)!bVar4 * auVar23._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar20._48_4_ = (uint)bVar4 * auVar18._48_4_ | (uint)!bVar4 * auVar23._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar20._52_4_ = (uint)bVar4 * auVar18._52_4_ | (uint)!bVar4 * auVar23._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar20._56_4_ = (uint)bVar4 * auVar18._56_4_ | (uint)!bVar4 * auVar23._56_4_;
    auVar20._60_4_ =
         (uint)(bVar9 >> 7) * auVar18._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar23._60_4_;
    auVar17 = vextracti64x4_avx512f(auVar20,1);
    auVar18 = vpmulld_avx512f(auVar20,ZEXT3264(auVar17));
    auVar5 = vpmulld_avx(auVar18._0_16_,auVar18._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    iVar27 = auVar5._0_4_;
  }
  if (iVar27 * (fx->d).bd != uVar11) {
    __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                  "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                 );
  }
  pfVar2 = fx->v;
  uVar12 = uVar13;
  if ((((ulong)pfVar2 & 3) == 0) &&
     (uVar12 = (ulong)(-((uint)((ulong)pfVar2 >> 2) & 0x3fffffff) & 0xf), uVar13 <= uVar12)) {
    uVar12 = uVar13;
  }
  pfVar3 = pTVar1->v;
  uVar14 = uVar13 - uVar12;
  uVar10 = uVar14 + 0xf;
  if (-1 < (long)uVar14) {
    uVar10 = uVar14;
  }
  if (uVar12 != 0) {
    uVar15 = 0;
    do {
      pfVar2[uVar15] = *(float *)(local_68._40_8_ + uVar15 * 4) * pfVar3[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar12 != uVar15);
  }
  uVar10 = (uVar10 & 0xfffffffffffffff0) + uVar12;
  if (0xf < (long)uVar14) {
    do {
      auVar18 = vmulps_avx512f(*(undefined1 (*) [64])(local_68._40_8_ + uVar12 * 4),
                               *(undefined1 (*) [64])(pfVar3 + uVar12));
      *(undefined1 (*) [64])(pfVar2 + uVar12) = auVar18;
      uVar12 = uVar12 + 0x10;
    } while ((long)uVar12 < (long)uVar10);
  }
  if ((long)uVar10 < (long)uVar13) {
    do {
      pfVar2[uVar10] = *(float *)(local_68._40_8_ + uVar10 * 4) * pfVar3[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar13 != uVar10);
  }
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&vStack_38);
  return;
}

Assistant:

void Dropout::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Dropout not yet implemented for CUDA");
#else
  Tensor m(dim, (float*)aux_mem);
  TensorTools::RandomBernoulli(m, (1.f-p), 1.f / (1.f-p));
  fx.vec() = xs[0]->vec().cwiseProduct(m.vec());
#endif
}